

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepbitfield(rnndb *db,rnnbitfield *bf,char *prefix,rnnvarinfo *parvi)

{
  char *pcVar1;
  char *pcVar2;
  char *tmp;
  rnnvarinfo *parvi_local;
  char *prefix_local;
  rnnbitfield *bf_local;
  rnndb *db_local;
  
  pcVar1 = catstr(prefix,bf->name);
  bf->fullname = pcVar1;
  prepvarinfo(db,bf->fullname,&bf->varinfo,parvi);
  if ((bf->varinfo).dead == 0) {
    if (bf->high == 0x3f) {
      bf->mask = -(1L << ((byte)bf->low & 0x3f));
    }
    else {
      bf->mask = (1L << ((char)bf->high + 1U & 0x3f)) - (1L << ((byte)bf->low & 0x3f));
    }
    preptypeinfo(db,&bf->typeinfo,bf->fullname,&bf->varinfo,(bf->high - bf->low) + 1,bf->file);
    if ((bf->varinfo).prefix != (char *)0x0) {
      pcVar1 = bf->fullname;
      pcVar2 = catstr((bf->varinfo).prefix,bf->fullname);
      bf->fullname = pcVar2;
      free(pcVar1);
    }
  }
  return;
}

Assistant:

static void prepbitfield(struct rnndb *db, struct rnnbitfield *bf, char *prefix, struct rnnvarinfo *parvi) {
	bf->fullname = catstr(prefix, bf->name);
	prepvarinfo (db, bf->fullname, &bf->varinfo, parvi);
	if (bf->varinfo.dead)
		return;
	if (bf->high == 63)
		bf->mask = - (1ULL<<bf->low);
	else
		bf->mask = (1ULL<<(bf->high+1)) - (1ULL<<bf->low);
	preptypeinfo(db, &bf->typeinfo, bf->fullname, &bf->varinfo, bf->high - bf->low + 1, bf->file);
	if (bf->varinfo.prefix) {
		char *tmp = bf->fullname;
		bf->fullname = catstr(bf->varinfo.prefix, bf->fullname);
		free(tmp);
	}
}